

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O0

void vepu510_h265_global_cfg_set(H265eV510HalContext *ctx,H265eV510RegSet *regs)

{
  MppEncSceneMode sm_00;
  RK_S32 atf_str_00;
  MppEncCfgSet *pMVar1;
  uint uVar2;
  H265eVepu510Sqi *reg;
  int iVar3;
  RK_S32 lambda_idx;
  RK_S32 atf_str;
  MppEncSceneMode sm;
  H265eVepu510Sqi *reg_sqi;
  H265eVepu510Param *reg_param;
  MppEncHwCfg *hw;
  H265eV510RegSet *regs_local;
  H265eV510HalContext *ctx_local;
  
  pMVar1 = ctx->cfg;
  reg = &regs->reg_sqi;
  sm_00 = (ctx->cfg->tune).scene_mode;
  atf_str_00 = (ctx->cfg->tune).anti_flicker_str;
  vepu510_h265_rdo_cfg(ctx,reg,sm_00);
  vepu510_h265_atf_cfg(reg,atf_str_00);
  vepu510_h265_smear_cfg(reg,ctx);
  memcpy((regs->reg_param).pprd_lamb_satd_0_51,lamd_satd_qp_510,0xd0);
  if (ctx->frame_type == 2) {
    (regs->reg_param).iprd_lamb_satd_ofst =
         (anon_struct_4_2_55ddf6cd_for_iprd_lamb_satd_ofst)
         ((uint)(regs->reg_param).iprd_lamb_satd_ofst & 0xffffffe0 | 0xb);
    memcpy((regs->reg_param).rdo_wgta_qp_grpa_0_51,
           rdo_lambda_table_I + (ctx->cfg->tune).lambda_idx_i,0xd0);
  }
  else {
    (regs->reg_param).iprd_lamb_satd_ofst =
         (anon_struct_4_2_55ddf6cd_for_iprd_lamb_satd_ofst)
         ((uint)(regs->reg_param).iprd_lamb_satd_ofst & 0xffffffe0 | 0xb);
    memcpy((regs->reg_param).rdo_wgta_qp_grpa_0_51,
           rdo_lambda_table_P + (ctx->cfg->tune).lambda_idx_p,0xd0);
  }
  (regs->reg_param).qnt_bias_comb =
       (anon_struct_4_3_9c489055_for_qnt_bias_comb)
       ((uint)(regs->reg_param).qnt_bias_comb & 0xfffffc00 | 0xab);
  (regs->reg_param).qnt_bias_comb =
       (anon_struct_4_3_9c489055_for_qnt_bias_comb)
       ((uint)(regs->reg_param).qnt_bias_comb & 0xfff003ff | 0x15400);
  if ((pMVar1->hw).qbias_en == 0) {
    if (ctx->smart_en != 0) {
      (regs->reg_param).qnt_bias_comb =
           (anon_struct_4_3_9c489055_for_qnt_bias_comb)
           ((uint)(regs->reg_param).qnt_bias_comb & 0xfffffc00 | 0x90);
    }
  }
  else {
    (regs->reg_param).qnt_bias_comb =
         (anon_struct_4_3_9c489055_for_qnt_bias_comb)
         ((uint)(regs->reg_param).qnt_bias_comb & 0xfffffc00 | (pMVar1->hw).qbias_i & 0x3ffU);
    (regs->reg_param).qnt_bias_comb =
         (anon_struct_4_3_9c489055_for_qnt_bias_comb)
         ((uint)(regs->reg_param).qnt_bias_comb & 0xfff003ff | ((pMVar1->hw).qbias_p & 0x3ffU) << 10
         );
  }
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)
       ((uint)(regs->reg_param).me_sqi_comb & 0xfffffffe | 1);
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)
       ((uint)(regs->reg_param).me_sqi_comb & 0xfffffffd | 2);
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)
       ((uint)(regs->reg_param).me_sqi_comb & 0xfffffffb | 4);
  iVar3 = 8;
  if (sm_00 == MPP_ENC_SCENE_MODE_IPC) {
    iVar3 = 2;
  }
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)
       ((uint)(regs->reg_param).me_sqi_comb & 0xffffff0f | iVar3 << 4);
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)
       ((uint)(regs->reg_param).me_sqi_comb & 0xfffffcff | 0x100);
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)
       ((uint)(regs->reg_param).me_sqi_comb & 0xfffff3ff | 0xc00);
  (regs->reg_param).me_sqi_comb =
       (anon_struct_4_9_cf71f709_for_me_sqi_comb)((uint)(regs->reg_param).me_sqi_comb & 0xffff8fff);
  (regs->reg_param).cime_mvd_th_comb =
       (anon_struct_4_6_50a91992_for_cime_mvd_th_comb)
       ((uint)(regs->reg_param).cime_mvd_th_comb & 0xfffffe00 | 8);
  (regs->reg_param).cime_mvd_th_comb =
       (anon_struct_4_6_50a91992_for_cime_mvd_th_comb)
       ((uint)(regs->reg_param).cime_mvd_th_comb & 0xfff803ff | 0x5000);
  (regs->reg_param).cime_mvd_th_comb =
       (anon_struct_4_6_50a91992_for_cime_mvd_th_comb)
       ((uint)(regs->reg_param).cime_mvd_th_comb & 0xe00fffff | 0x2000000);
  uVar2 = 0;
  if (sm_00 == MPP_ENC_SCENE_MODE_IPC) {
    uVar2 = 0x10;
  }
  (regs->reg_param).cime_madp_th_comb =
       (anon_struct_4_2_eb68bd57_for_cime_madp_th_comb)
       ((uint)(regs->reg_param).cime_madp_th_comb & 0xfffff000 | uVar2);
  if (sm_00 == MPP_ENC_SCENE_MODE_IPC) {
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xffffff00 | 8);
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xffff00ff | 0xc00);
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xff00ffff | 0x100000);
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xffffff | 0x14000000);
    (regs->reg_param).rime_mvd_th_comb =
         (anon_struct_4_6_2a849c97_for_rime_mvd_th_comb)
         ((uint)(regs->reg_param).rime_mvd_th_comb & 0xfffffff8 | 1);
    (regs->reg_param).rime_mvd_th_comb =
         (anon_struct_4_6_2a849c97_for_rime_mvd_th_comb)
         ((uint)(regs->reg_param).rime_mvd_th_comb & 0xffffff8f | 0x20);
    (regs->reg_param).rime_mvd_th_comb =
         (anon_struct_4_6_2a849c97_for_rime_mvd_th_comb)
         ((uint)(regs->reg_param).rime_mvd_th_comb & 0xf000ffff);
    (regs->reg_param).rime_madp_th_comb =
         (anon_struct_4_4_aac78565_for_rime_madp_th_comb)
         ((uint)(regs->reg_param).rime_madp_th_comb & 0xfffff000 | 8);
    (regs->reg_param).rime_madp_th_comb =
         (anon_struct_4_4_aac78565_for_rime_madp_th_comb)
         ((uint)(regs->reg_param).rime_madp_th_comb & 0xf000ffff | 0x100000);
    (regs->reg_param).rime_multi_comb =
         (anon_struct_4_4_09458543_for_rime_multi_comb)
         ((uint)(regs->reg_param).rime_multi_comb & 0xfffffc00 | 4);
    (regs->reg_param).rime_multi_comb =
         (anon_struct_4_4_09458543_for_rime_multi_comb)
         ((uint)(regs->reg_param).rime_multi_comb & 0xfff003ff | 0x2000);
    (regs->reg_param).rime_multi_comb =
         (anon_struct_4_4_09458543_for_rime_multi_comb)
         ((uint)(regs->reg_param).rime_multi_comb & 0xc00fffff | 0xc00000);
  }
  else {
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xffffff00 | 4);
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xffff00ff | 0x400);
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xff00ffff | 0x40000);
    (regs->reg_param).cime_multi_comb =
         (anon_struct_4_4_edbea1c3_for_cime_multi_comb)
         ((uint)(regs->reg_param).cime_multi_comb & 0xffffff | 0x4000000);
    (regs->reg_param).rime_mvd_th_comb =
         (anon_struct_4_6_2a849c97_for_rime_mvd_th_comb)
         ((uint)(regs->reg_param).rime_mvd_th_comb & 0xfffffff8);
    (regs->reg_param).rime_mvd_th_comb =
         (anon_struct_4_6_2a849c97_for_rime_mvd_th_comb)
         ((uint)(regs->reg_param).rime_mvd_th_comb & 0xffffff8f);
    (regs->reg_param).rime_mvd_th_comb =
         (anon_struct_4_6_2a849c97_for_rime_mvd_th_comb)
         ((uint)(regs->reg_param).rime_mvd_th_comb & 0xf000ffff | 0x1e0000);
    (regs->reg_param).rime_madp_th_comb =
         (anon_struct_4_4_aac78565_for_rime_madp_th_comb)
         ((uint)(regs->reg_param).rime_madp_th_comb & 0xfffff000);
    (regs->reg_param).rime_madp_th_comb =
         (anon_struct_4_4_aac78565_for_rime_madp_th_comb)
         ((uint)(regs->reg_param).rime_madp_th_comb & 0xf000ffff);
    (regs->reg_param).rime_multi_comb =
         (anon_struct_4_4_09458543_for_rime_multi_comb)
         ((uint)(regs->reg_param).rime_multi_comb & 0xfffffc00 | 4);
    (regs->reg_param).rime_multi_comb =
         (anon_struct_4_4_09458543_for_rime_multi_comb)
         ((uint)(regs->reg_param).rime_multi_comb & 0xfff003ff | 0x1000);
    (regs->reg_param).rime_multi_comb =
         (anon_struct_4_4_09458543_for_rime_multi_comb)
         ((uint)(regs->reg_param).rime_multi_comb & 0xc00fffff | 0x400000);
  }
  (regs->reg_rc_roi).madi_st_thd =
       (anon_struct_4_4_807e1bd2_for_madi_st_thd)
       ((uint)(regs->reg_rc_roi).madi_st_thd & 0xffffff00 | 5);
  (regs->reg_rc_roi).madi_st_thd =
       (anon_struct_4_4_807e1bd2_for_madi_st_thd)
       ((uint)(regs->reg_rc_roi).madi_st_thd & 0xffff00ff | 0xc00);
  (regs->reg_rc_roi).madi_st_thd =
       (anon_struct_4_4_807e1bd2_for_madi_st_thd)
       ((uint)(regs->reg_rc_roi).madi_st_thd & 0xff00ffff | 0x140000);
  (regs->reg_rc_roi).madp_st_thd0 =
       (anon_struct_4_4_1da63ba5_for_madp_st_thd0)
       ((uint)(regs->reg_rc_roi).madp_st_thd0 & 0xfffff000 | 0x40);
  (regs->reg_rc_roi).madp_st_thd0 =
       (anon_struct_4_4_1da63ba5_for_madp_st_thd0)
       ((uint)(regs->reg_rc_roi).madp_st_thd0 & 0xf000ffff | 0x900000);
  (regs->reg_rc_roi).madp_st_thd1 =
       (anon_struct_4_2_d4966a0a_for_madp_st_thd1)
       ((uint)(regs->reg_rc_roi).madp_st_thd1 & 0xfffff000 | 0xf0);
  (regs->reg_param).cmv_st_th_comb =
       (anon_struct_4_4_73a8c0fd_for_cmv_st_th_comb)
       ((uint)(regs->reg_param).cmv_st_th_comb & 0xffffff00 | 0x40);
  (regs->reg_param).cmv_st_th_comb =
       (anon_struct_4_4_73a8c0fd_for_cmv_st_th_comb)
       ((uint)(regs->reg_param).cmv_st_th_comb & 0xffff00ff | 0x6000);
  (regs->reg_param).cmv_st_th_comb =
       (anon_struct_4_4_73a8c0fd_for_cmv_st_th_comb)
       ((uint)(regs->reg_param).cmv_st_th_comb & 0xff00ffff | 0x800000);
  return;
}

Assistant:

static void vepu510_h265_global_cfg_set(H265eV510HalContext *ctx, H265eV510RegSet *regs)
{
    MppEncHwCfg *hw = &ctx->cfg->hw;
    H265eVepu510Param *reg_param = &regs->reg_param;
    H265eVepu510Sqi  *reg_sqi = &regs->reg_sqi;
    MppEncSceneMode sm = ctx->cfg->tune.scene_mode;
    RK_S32 atf_str = ctx->cfg->tune.anti_flicker_str;
    RK_S32 lambda_idx = 0;

    vepu510_h265_rdo_cfg(ctx, reg_sqi, sm);
    vepu510_h265_atf_cfg(reg_sqi, atf_str);
    vepu510_h265_smear_cfg(reg_sqi, ctx);
    memcpy(&reg_param->pprd_lamb_satd_0_51[0], lamd_satd_qp_510, sizeof(lamd_satd_qp));

    if (ctx->frame_type == INTRA_FRAME) {
        reg_param->iprd_lamb_satd_ofst.lambda_satd_offset = 11;
        lambda_idx = ctx->cfg->tune.lambda_idx_i;
        memcpy(&reg_param->rdo_wgta_qp_grpa_0_51[0],
               &rdo_lambda_table_I[lambda_idx], H265E_LAMBDA_TAB_SIZE);
    } else {
        reg_param->iprd_lamb_satd_ofst.lambda_satd_offset = 11;
        lambda_idx = ctx->cfg->tune.lambda_idx_p;
        memcpy(&reg_param->rdo_wgta_qp_grpa_0_51[0],
               &rdo_lambda_table_P[lambda_idx], H265E_LAMBDA_TAB_SIZE);
    }

    reg_param->qnt_bias_comb.qnt_f_bias_i = 171;
    reg_param->qnt_bias_comb.qnt_f_bias_p = 85;
    if (hw->qbias_en) {
        reg_param->qnt_bias_comb.qnt_f_bias_i = hw->qbias_i;
        reg_param->qnt_bias_comb.qnt_f_bias_p = hw->qbias_p;
    } else if (ctx->smart_en) {
        reg_param->qnt_bias_comb.qnt_f_bias_i = 144;
    }

    /* CIME */
    {
        reg_param->me_sqi_comb.cime_pmv_num = 1;
        reg_param->me_sqi_comb.cime_fuse   = 1;
        reg_param->me_sqi_comb.itp_mode    = 1;
        reg_param->me_sqi_comb.move_lambda = (sm == MPP_ENC_SCENE_MODE_IPC) ? 2 : 8;
        reg_param->me_sqi_comb.rime_lvl_mrg     = 1;
        reg_param->me_sqi_comb.rime_prelvl_en   = 3;
        reg_param->me_sqi_comb.rime_prersu_en   = 0;
        reg_param->cime_mvd_th_comb.cime_mvd_th0 = 8;
        reg_param->cime_mvd_th_comb.cime_mvd_th1 = 20;
        reg_param->cime_mvd_th_comb.cime_mvd_th2 = 32;
        reg_param->cime_madp_th_comb.cime_madp_th = (sm == MPP_ENC_SCENE_MODE_IPC) ? 16 : 0;

        if (sm == MPP_ENC_SCENE_MODE_IPC) {
            reg_param->cime_multi_comb.cime_multi0 = 8;
            reg_param->cime_multi_comb.cime_multi1 = 12;
            reg_param->cime_multi_comb.cime_multi2 = 16;
            reg_param->cime_multi_comb.cime_multi3 = 20;
        } else {
            reg_param->cime_multi_comb.cime_multi0 = 4;
            reg_param->cime_multi_comb.cime_multi1 = 4;
            reg_param->cime_multi_comb.cime_multi2 = 4;
            reg_param->cime_multi_comb.cime_multi3 = 4;
        }
    }

    /* RIME && FME */
    if (sm == MPP_ENC_SCENE_MODE_IPC) {
        reg_param->rime_mvd_th_comb.rime_mvd_th0  = 1;
        reg_param->rime_mvd_th_comb.rime_mvd_th1  = 2;
        reg_param->rime_mvd_th_comb.fme_madp_th   = 0;
        reg_param->rime_madp_th_comb.rime_madp_th0 = 8;
        reg_param->rime_madp_th_comb.rime_madp_th1 = 16;
        reg_param->rime_multi_comb.rime_multi0 = 4;
        reg_param->rime_multi_comb.rime_multi1 = 8;
        reg_param->rime_multi_comb.rime_multi2 = 12;
    } else {
        reg_param->rime_mvd_th_comb.rime_mvd_th0  = 0;
        reg_param->rime_mvd_th_comb.rime_mvd_th1  = 0;
        reg_param->rime_mvd_th_comb.fme_madp_th   = 30;
        reg_param->rime_madp_th_comb.rime_madp_th0 = 0;
        reg_param->rime_madp_th_comb.rime_madp_th1 = 0;
        reg_param->rime_multi_comb.rime_multi0 = 4;
        reg_param->rime_multi_comb.rime_multi1 = 4;
        reg_param->rime_multi_comb.rime_multi2 = 4;
    }

    {
        /* 0x1064 */
        regs->reg_rc_roi.madi_st_thd.madi_th0 = 5;
        regs->reg_rc_roi.madi_st_thd.madi_th1 = 12;
        regs->reg_rc_roi.madi_st_thd.madi_th2 = 20;
        /* 0x1068 */
        regs->reg_rc_roi.madp_st_thd0.madp_th0 = 4 << 4;
        regs->reg_rc_roi.madp_st_thd0.madp_th1 = 9 << 4;
        /* 0x106C */
        regs->reg_rc_roi.madp_st_thd1.madp_th2 = 15 << 4;

        /* 0x177C */
        reg_param->cmv_st_th_comb.cmv_th0 = 64;
        reg_param->cmv_st_th_comb.cmv_th1 = 96;
        reg_param->cmv_st_th_comb.cmv_th2 = 128;
    }
}